

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall spectest::JSONParser::ParseLine(JSONParser *this,uint32_t *out_line_number)

{
  Result RVar1;
  Enum EVar2;
  
  RVar1 = ExpectKey(this,"line");
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = ParseUint32(this,out_line_number);
    EVar2 = (Enum)(RVar1.enum_ == Error);
  }
  return (Result)EVar2;
}

Assistant:

wabt::Result JSONParser::ParseLine(uint32_t* out_line_number) {
  EXPECT_KEY("line");
  CHECK_RESULT(ParseUint32(out_line_number));
  return wabt::Result::Ok;
}